

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int __thiscall phosg::scoped_fd::open(scoped_fd *this,char *__file,int __oflag,...)

{
  int iVar1;
  cannot_open_file *this_00;
  uint in_ECX;
  allocator<char> local_41;
  string local_40;
  
  close(this,(int)__file);
  iVar1 = ::open(__file,__oflag,(ulong)in_ECX);
  this->fd = iVar1;
  if (-1 < iVar1) {
    return iVar1;
  }
  this_00 = (cannot_open_file *)__cxa_allocate_exception(0x20);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__file,&local_41);
  cannot_open_file::cannot_open_file(this_00,&local_40);
  __cxa_throw(this_00,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

void scoped_fd::open(const char* filename, int mode, mode_t perm) {
  this->close();
  this->fd = ::open(filename, mode, perm);
  if (this->fd < 0) {
    throw cannot_open_file(filename);
  }
}